

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O1

err_t dstuPointCompress(octet *xpoint,dstu_params *params,octet *point)

{
  word *stack;
  qr_o *pqVar1;
  ec_o *blob;
  err_t eVar2;
  bool_t bVar3;
  word *a;
  word *a_00;
  ec_o *ec;
  ec_o *local_38;
  
  local_38 = (ec_o *)0x0;
  eVar2 = dstuEcCreate(&local_38,params,dstuPointCompress_deep);
  blob = local_38;
  if (eVar2 == 0) {
    bVar3 = memIsValid(point,local_38->f->no * 2);
    if ((bVar3 != 0) && (bVar3 = memIsValid(xpoint,blob->f->no), bVar3 != 0)) {
      a = (word *)((long)&(blob->hdr).keep + (blob->hdr).keep);
      pqVar1 = blob->f;
      a_00 = a + pqVar1->n;
      stack = a_00 + pqVar1->n;
      bVar3 = (*pqVar1->from)(a,point,pqVar1,stack);
      if (bVar3 != 0) {
        pqVar1 = blob->f;
        bVar3 = (*pqVar1->from)(a_00,point + pqVar1->no,pqVar1,stack);
        if (bVar3 != 0) {
          bVar3 = wwIsZero(a,blob->f->n);
          if (bVar3 == 0) {
            (*blob->f->div)(a_00,a_00,a,blob->f,stack);
            memMove(xpoint,point,blob->f->no);
            *xpoint = *xpoint & 0xfe;
            bVar3 = gf2Tr(a_00,blob->f,stack);
            *xpoint = *xpoint | (byte)bVar3;
          }
          blobClose(blob);
          return 0;
        }
      }
      blobClose(blob);
      return 0x191;
    }
    blobClose(blob);
    eVar2 = 0x6d;
  }
  return eVar2;
}

Assistant:

err_t dstuPointCompress(octet xpoint[], const dstu_params* params, 
	const octet point[])
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	word* x;
	word* y;
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuPointCompress_deep);
	ERR_CALL_CHECK(code);
	// проверить входные указатели
	if (!memIsValid(point, 2 * ec->f->no) || 
		!memIsValid(xpoint, ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	x = objEnd(ec, word);
	y = x + ec->f->n;
	stack = y + ec->f->n;
	// загрузить точку
	if (!qrFrom(x, point, ec->f, stack) ||
		!qrFrom(y, point + ec->f->no, ec->f, stack))
	{
		dstuEcClose(ec);
		return ERR_BAD_POINT;
	}
	// x == 0?
	if (wwIsZero(x, ec->f->n))
	{
		dstuEcClose(ec);
		return ERR_OK;
	}
	// y <- y / x
	qrDiv(y, y, x, ec->f, stack);
	// xpoint <- x(point), xpoint_0 <- tr(y)
	memMove(xpoint, point, ec->f->no);
	xpoint[0] &= 0xFE;
	xpoint[0] |= gf2Tr(y, ec->f, stack);
	// завершение
	dstuEcClose(ec);
	return ERR_OK;
}